

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O1

int ASN1_STRING_print_ex(BIO *out,ASN1_STRING *str,ulong flags)

{
  int iVar1;
  uint encoding;
  int iVar2;
  char *__s;
  size_t sVar3;
  int len;
  bool bVar4;
  uchar *der_buf;
  char quotes;
  uchar *local_50;
  ASN1_TYPE local_48;
  
  iVar2 = str->type;
  len = 0;
  if ((flags & 0x40) != 0) {
    __s = ASN1_tag2str(iVar2);
    sVar3 = strlen(__s);
    bVar4 = true;
    len = (int)sVar3;
    if (out == (BIO *)0x0) {
LAB_0020684c:
      len = len + (uint)bVar4;
    }
    else {
      iVar1 = BIO_write(out,__s,len);
      if (iVar1 == len) {
        if (out != (BIO *)0x0) {
          iVar1 = BIO_write(out,":",1);
          bVar4 = iVar1 == 1;
        }
        goto LAB_0020684c;
      }
      bVar4 = false;
    }
    if (bVar4 == false) {
      return -1;
    }
  }
  encoding = 0xffffffff;
  if (((-1 < (char)flags) && (encoding = 0x1001, (flags & 0x20) == 0)) &&
     (encoding = string_type_to_encoding(iVar2), encoding == 0xffffffff)) {
    encoding = -(uint)(((uint)flags >> 8 & 1) != 0) | 0x1001;
  }
  if (encoding != 0xffffffff) {
    local_48._0_8_ = local_48._0_8_ & 0xffffffffffffff00;
    iVar2 = do_buf(str->data,str->length,encoding,flags,(char *)&local_48,(BIO *)0x0);
    if (iVar2 < 0) {
      return -1;
    }
    iVar1 = iVar2 + 2;
    if ((char)local_48.type == '\0') {
      iVar1 = iVar2;
    }
    if (out != (BIO *)0x0) {
      if (((char)local_48.type != '\0') && (iVar2 = BIO_write(out,"\"",1), iVar2 != 1)) {
        return -1;
      }
      iVar2 = do_buf(str->data,str->length,encoding,flags,(char *)0x0,(BIO *)out);
      if (iVar2 < 0) {
        return -1;
      }
      if (((char)local_48.type != '\0') && (iVar2 = BIO_write(out,"\"",1), iVar2 != 1)) {
        return -1;
      }
    }
    return iVar1 + len;
  }
  if (out != (BIO *)0x0) {
    iVar1 = BIO_write(out,"#",1);
    iVar2 = -1;
    if (iVar1 != 1) goto LAB_00206a00;
  }
  if (((uint)flags >> 9 & 1) == 0) {
    iVar1 = do_hex_dump((BIO *)out,str->data,str->length);
    iVar2 = -1;
    if (-1 < iVar1) {
      iVar2 = iVar1 + 1;
    }
  }
  else {
    local_48.type = 0;
    local_48._4_4_ = 0;
    local_48.value.ptr = (char *)0x0;
    asn1_type_set0_string((ASN1_TYPE *)&local_48,(ASN1_STRING *)str);
    local_50 = (uchar *)0x0;
    iVar2 = i2d_ASN1_TYPE(&local_48,&local_50);
    if (iVar2 < 0) {
      iVar2 = -1;
    }
    else {
      iVar1 = do_hex_dump((BIO *)out,local_50,iVar2);
      OPENSSL_free(local_50);
      iVar2 = -1;
      if (-1 < iVar1) {
        iVar2 = iVar1 + 1;
      }
    }
  }
LAB_00206a00:
  iVar1 = -1;
  if (-1 < iVar2) {
    iVar1 = len + iVar2;
  }
  return iVar1;
}

Assistant:

int ASN1_STRING_print_ex(BIO *out, const ASN1_STRING *str,
                         unsigned long flags) {
  int type = str->type;
  int outlen = 0;
  if (flags & ASN1_STRFLGS_SHOW_TYPE) {
    const char *tagname = ASN1_tag2str(type);
    outlen += strlen(tagname);
    if (!maybe_write(out, tagname, outlen) || !maybe_write(out, ":", 1)) {
      return -1;
    }
    outlen++;
  }

  // Decide what to do with |str|, either dump the contents or display it.
  int encoding;
  if (flags & ASN1_STRFLGS_DUMP_ALL) {
    // Dump everything.
    encoding = -1;
  } else if (flags & ASN1_STRFLGS_IGNORE_TYPE) {
    // Ignore the string type and interpret the contents as Latin-1.
    encoding = MBSTRING_ASC;
  } else {
    encoding = string_type_to_encoding(type);
    if (encoding == -1 && (flags & ASN1_STRFLGS_DUMP_UNKNOWN) == 0) {
      encoding = MBSTRING_ASC;
    }
  }

  if (encoding == -1) {
    int len = do_dump(flags, out, str);
    if (len < 0) {
      return -1;
    }
    outlen += len;
    return outlen;
  }

  // Measure the length.
  char quotes = 0;
  int len = do_buf(str->data, str->length, encoding, flags, &quotes, NULL);
  if (len < 0) {
    return -1;
  }
  outlen += len;
  if (quotes) {
    outlen += 2;
  }
  if (!out) {
    return outlen;
  }

  // Encode the value.
  if ((quotes && !maybe_write(out, "\"", 1)) ||
      do_buf(str->data, str->length, encoding, flags, NULL, out) < 0 ||
      (quotes && !maybe_write(out, "\"", 1))) {
    return -1;
  }
  return outlen;
}